

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::FboCases::TexSubImageBetweenRenderTest::TexSubImageBetweenRenderTest
          (TexSubImageBetweenRenderTest *this,Context *context,FboConfig *config)

{
  allocator<char> local_79;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"between_render_",&local_79);
  FboConfig::getName_abi_cxx11_(&local_78,config);
  std::operator+(&local_38,&local_58,&local_78);
  FboRenderCase::FboRenderCase
            (&this->super_FboRenderCase,context,local_38._M_dataplus._M_p,
             "TexSubImage between rendering calls",config);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e1b748;
  return;
}

Assistant:

TexSubImageBetweenRenderTest::TexSubImageBetweenRenderTest (Context& context, const FboConfig& config)
	: FboRenderCase(context, (string("between_render_") + config.getName()).c_str(), "TexSubImage between rendering calls", config)
{
}